

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examine_stack.cc
# Opt level: O3

void absl::debugging_internal::DumpStackTrace
               (int min_dropped_frames,int max_num_frames,bool symbolize_stacktrace,
               OutputWriter *writer,void *writer_arg)

{
  void *pc;
  bool bVar1;
  uint uVar2;
  void **ppvVar3;
  char *pcVar4;
  void **result;
  ulong uVar5;
  void *stack_buf [64];
  char tmp [1024];
  char buf [1024];
  size_t local_a40;
  void *local_a38 [64];
  char local_838 [1024];
  char local_438 [1032];
  
  if (max_num_frames < 0x41) {
    local_a40 = 0;
    result = local_a38;
  }
  else {
    local_a40 = (ulong)(uint)max_num_frames << 3;
    ppvVar3 = (void **)mmap((void *)0x0,local_a40,3,0x22,-1,0);
    if (ppvVar3 == (void **)0xffffffffffffffff) {
      ppvVar3 = (void **)0x0;
    }
    if (ppvVar3 == (void **)0x0) {
      max_num_frames = 0x40;
      local_a40 = 0;
    }
    result = local_a38;
    if (ppvVar3 != (void **)0x0) {
      result = ppvVar3;
    }
  }
  uVar2 = GetStackTrace(result,max_num_frames,min_dropped_frames + 1);
  if (0 < (int)uVar2) {
    uVar5 = 0;
    do {
      pc = result[uVar5];
      if (symbolize_stacktrace) {
        bVar1 = Symbolize((void *)((long)pc + -1),local_838,0x400);
        if (bVar1) {
LAB_0012ba40:
          pcVar4 = local_838;
        }
        else {
          bVar1 = Symbolize(pc,local_838,0x400);
          pcVar4 = "(unknown)";
          if (bVar1) goto LAB_0012ba40;
        }
        snprintf(local_438,0x400,"%s@ %*p  %s\n","    ",0x12,pc,pcVar4);
        (*writer)(local_438,writer_arg);
      }
      else {
        snprintf(local_838,100,"%s@ %*p\n","    ",0x12,pc);
        (*writer)(local_838,writer_arg);
      }
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  if ((anonymous_namespace)::debug_stack_trace_hook != (code *)0x0) {
    (*(anonymous_namespace)::debug_stack_trace_hook)(result,uVar2,writer,writer_arg);
  }
  if (local_a40 != 0) {
    munmap(result,local_a40);
  }
  return;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE
void DumpStackTrace(int min_dropped_frames, int max_num_frames,
                    bool symbolize_stacktrace, OutputWriter* writer,
                    void* writer_arg) {
  // Print stack trace
  void* stack_buf[kDefaultDumpStackFramesLimit];
  void** stack = stack_buf;
  int num_stack = kDefaultDumpStackFramesLimit;
  size_t allocated_bytes = 0;

  if (num_stack >= max_num_frames) {
    // User requested fewer frames than we already have space for.
    num_stack = max_num_frames;
  } else {
    const size_t needed_bytes =
        static_cast<size_t>(max_num_frames) * sizeof(stack[0]);
    void* p = Allocate(needed_bytes);
    if (p != nullptr) {  // We got the space.
      num_stack = max_num_frames;
      stack = reinterpret_cast<void**>(p);
      allocated_bytes = needed_bytes;
    }
  }

  int depth = absl::GetStackTrace(stack, num_stack, min_dropped_frames + 1);
  for (int i = 0; i < depth; i++) {
    if (symbolize_stacktrace) {
      DumpPCAndSymbol(writer, writer_arg, stack[static_cast<size_t>(i)],
                      "    ");
    } else {
      DumpPC(writer, writer_arg, stack[static_cast<size_t>(i)], "    ");
    }
  }

  auto hook = GetDebugStackTraceHook();
  if (hook != nullptr) {
    (*hook)(stack, depth, writer, writer_arg);
  }

  if (allocated_bytes != 0) Deallocate(stack, allocated_bytes);
}